

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_AES_PDF.cc
# Opt level: O0

void __thiscall Pl_AES_PDF::initializeVector(Pl_AES_PDF *this)

{
  uint local_18;
  uint local_14;
  uint i_1;
  uint i;
  Pl_AES_PDF *this_local;
  
  if ((this->use_zero_iv & 1U) == 0) {
    if ((this->use_specified_iv & 1U) == 0) {
      if (use_static_iv) {
        for (local_18 = 0; local_18 < 0x10; local_18 = local_18 + 1) {
          this->cbc_block[local_18] = ((char)local_18 + '\x01') * '\x0e';
        }
      }
      else {
        QUtil::initializeWithRandomBytes(this->cbc_block,0x10);
      }
    }
    else {
      *(undefined8 *)this->cbc_block = *(undefined8 *)this->specified_iv;
      *(undefined8 *)(this->cbc_block + 8) = *(undefined8 *)(this->specified_iv + 8);
    }
  }
  else {
    for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
      this->cbc_block[local_14] = '\0';
    }
  }
  return;
}

Assistant:

void
Pl_AES_PDF::initializeVector()
{
    if (use_zero_iv) {
        for (unsigned int i = 0; i < this->buf_size; ++i) {
            this->cbc_block[i] = 0;
        }
    } else if (use_specified_iv) {
        std::memcpy(this->cbc_block, this->specified_iv, this->buf_size);
    } else if (use_static_iv) {
        for (unsigned int i = 0; i < this->buf_size; ++i) {
            this->cbc_block[i] = static_cast<unsigned char>(14U * (1U + i));
        }
    } else {
        QUtil::initializeWithRandomBytes(this->cbc_block, this->buf_size);
    }
}